

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

cf_bool_t cf_memchk_deinit_and_summary(void)

{
  cf_size_t cVar1;
  cf_hashtbl_iter_t it;
  undefined8 *puVar2;
  
  cVar1 = g_memchk_ctx.alloc_size;
  if (g_memchk_ctx.alloc_size == 0) {
    puts("[memchk][leak] No leaks!");
  }
  else {
    printf("[memchk][leak] has leaks, leak size: %ud\n",g_memchk_ctx.alloc_size & 0xffffffff);
  }
  for (it = cf_hashtbl_iter_init(g_memchk_ctx.alloc_info); it != (cf_hashtbl_iter_t)0x0;
      it = cf_hashtbl_iter_next(it)) {
    puVar2 = (undefined8 *)cf_hashtbl_iter_value(it);
    if (puVar2 != (undefined8 *)0x0) {
      printf("[%s@%d : %s] leak: %udbytes, stack: %s\n",*puVar2,(ulong)*(uint *)(puVar2 + 2),
             puVar2[1],(ulong)*(uint *)(puVar2 + 3),puVar2 + 4);
    }
  }
  cf_hashtbl_delete(g_memchk_ctx.alloc_info);
  cf_mutex_destroy(&g_memchk_ctx.mutex);
  g_memchk_ctx.inited = 0;
  g_memchk_ctx._4_4_ = 0;
  g_memchk_ctx.alloc_info = (cf_hashtbl_t *)0x0;
  g_memchk_ctx.mutex.__align = 0;
  g_memchk_ctx.mutex._8_8_ = 0;
  g_memchk_ctx.mutex._16_8_ = 0;
  g_memchk_ctx.mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  g_memchk_ctx.mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  g_memchk_ctx.alloc_size = 0;
  return (cf_bool_t)(cVar1 == 0);
}

Assistant:

cf_bool_t cf_memchk_deinit_and_summary() {
    cf_bool_t is_success = CF_TRUE;
#ifdef CF_MEMORY_DBG
    cf_hashtbl_iter_t it;
    malloc_info* info;
    is_success = (g_memchk_ctx.alloc_size == 0);
    if (is_success) {
        printf("[memchk][leak] No leaks!\n");
    } else {
        printf("[memchk][leak] has leaks, leak size: %ud\n", (cf_uint32_t)g_memchk_ctx.alloc_size);
    }

    for (it = cf_hashtbl_iter_init(g_memchk_ctx.alloc_info);
        !cf_hashtbl_iter_end(it);
        it = cf_hashtbl_iter_next(it)) {
        info = cf_hashtbl_iter_value(it);
        if (info != CF_NULL_PTR) {
            printf("[%s@%d : %s] leak: %udbytes, stack: %s\n", info->location.file_name,
                info->location.line_number, info->location.function_name, (cf_uint32_t)info->size,
                info->info);
        }
    }
    
    cf_hashtbl_delete(g_memchk_ctx.alloc_info);
    cf_mutex_destroy(&g_memchk_ctx.mutex);
    cf_membzero(&g_memchk_ctx, sizeof(g_memchk_ctx));
#endif
    return is_success;
}